

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsTextItem::paint
          (QGraphicsTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  long lVar1;
  QFlagsStorage<QStyle::StateFlag> QVar2;
  Int IVar3;
  QTextDocument *this_00;
  QRectF *this_01;
  QGraphicsTextItemPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentLayout *layout;
  QTextDocument *doc;
  QRectF r;
  QPointF *in_stack_ffffffffffffff18;
  QRectF *in_stack_ffffffffffffff20;
  QFlagsStorage<QStyle::StateFlag> in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff70;
  QPainter *in_stack_ffffffffffffff78;
  QGraphicsItem *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->data->winid != 0) {
    QPainter::save();
    QGraphicsTextItemPrivate::controlOffset(in_RSI);
    ::operator-((QPointF *)in_RSI);
    QPainter::translate((QPointF *)in_RSI);
    QGraphicsTextItemPrivate::controlOffset(in_RSI);
    QRectF::translate(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    this_00 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_ffffffffffffff20);
    QTextDocument::documentLayout();
    this_01 = (QRectF *)qobject_cast<QTextDocumentLayout*>((QObject *)0x98c10b);
    if (this_01 != (QRectF *)0x0) {
      QTextDocumentLayout::setViewport((QRectF *)this_01);
    }
    QWidgetTextControl::drawContents
              ((QWidgetTextControl *)this_00,(QPainter *)this_01,
               (QRectF *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI);
    if (this_01 != (QRectF *)0x0) {
      QRect::QRect((QRect *)this_01);
      QRectF::QRectF((QRectF *)in_RDI,(QRect *)in_RSI);
      QTextDocumentLayout::setViewport((QRectF *)this_01);
      in_stack_ffffffffffffff20 = this_01;
    }
    in_stack_ffffffffffffff28.i = (Int)in_RSI;
    QPainter::restore();
  }
  ::operator|((enum_type)((ulong)in_stack_ffffffffffffff20 >> 0x20),
              (enum_type)in_stack_ffffffffffffff20);
  QVar2.i = (Int)QFlags<QStyle::StateFlag>::operator&
                           ((QFlags<QStyle::StateFlag> *)in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff28.i);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff74);
  if (IVar3 != 0) {
    qt_graphicsItem_highlightSelected
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (QStyleOptionGraphicsItem *)CONCAT44(QVar2.i,in_stack_ffffffffffffff70));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_UNUSED(widget);
    if (dd->control) {
        painter->save();
        QRectF r = option->exposedRect;
        painter->translate(-dd->controlOffset());
        r.translate(dd->controlOffset());

        QTextDocument *doc = dd->control->document();
        QTextDocumentLayout *layout = qobject_cast<QTextDocumentLayout *>(doc->documentLayout());

        // the layout might need to expand the root frame to
        // the viewport if NoWrap is set
        if (layout)
            layout->setViewport(dd->boundingRect);

        dd->control->drawContents(painter, r);

        if (layout)
            layout->setViewport(QRect());

        painter->restore();
    }

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}